

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall
Clasp::Solver::finalizeConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,uint32 ccRepMode)

{
  pointer pLVar1;
  uint *puVar2;
  uint32 uVar3;
  pointer puVar4;
  pointer pDVar5;
  uint64 uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  Literal p;
  uint uVar12;
  int iVar13;
  long lVar14;
  pointer pLVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  pointer pLVar20;
  bool bVar21;
  uint local_48;
  Literal local_38;
  Literal local_34;
  
  uVar19 = ((cc->ebo_).buf)->rep_ >> 2;
  uVar7 = (this->tag_).rep_;
  bVar9 = false;
  uVar8 = 1;
  uVar18 = 0;
  iVar13 = 0;
  local_48 = 1;
  for (uVar11 = 1; uVar11 != (cc->ebo_).size; uVar11 = uVar11 + 1) {
    pLVar20 = (cc->ebo_).buf;
    uVar16 = pLVar20[uVar11].rep_;
    uVar10 = uVar16 >> 2;
    puVar4 = (this->assign_).assign_.ebo_.buf;
    uVar17 = (ulong)(uVar16 & 0xfffffffc);
    uVar16 = *(uint *)((long)puVar4 + uVar17);
    *(uint *)((long)puVar4 + uVar17) = uVar16 & 0xfffffff3;
    uVar12 = pLVar20[uVar11].rep_;
    if (uVar19 < uVar10) {
      uVar19 = uVar10;
    }
    uVar16 = uVar16 >> 4;
    if (uVar18 < uVar16) {
      uVar8 = (ulong)uVar11;
      uVar18 = uVar16;
    }
    pDVar5 = (this->levels_).super_type.ebo_.buf;
    uVar10 = *(uint *)(pDVar5 + (uVar16 - 1));
    if ((uVar10 >> 0x1e & 1) != 0) {
      *(uint *)(pDVar5 + (uVar16 - 1)) = uVar10 & 0xbfffffff;
      uVar10 = (this->levels_).root;
      bVar21 = iVar13 == 0;
      iVar13 = iVar13 + (uint)(uVar16 <= uVar10);
      local_48 = local_48 + (bVar21 || uVar10 < uVar16);
    }
    bVar9 = (bool)(bVar9 | (uVar12 ^ uVar7 ^ 2) < 2);
  }
  if ((int)uVar8 != 1) {
    pLVar20 = (cc->ebo_).buf;
    uVar3 = pLVar20[1].rep_;
    pLVar20[1].rep_ = pLVar20[uVar8].rep_;
    pLVar20[uVar8].rep_ = uVar3;
  }
  if (ccRepMode != 0) {
    if (ccRepMode == 3) {
      if ((double)local_48 / (double)(this->levels_).super_type.ebo_.size <= 0.66) {
        ccRepMode = 2;
      }
      else {
        ccRepMode = 1;
      }
    }
    pLVar20 = (cc->ebo_).buf;
    uVar19 = pLVar20->rep_ >> 2;
    if (ccRepMode == 1) {
      local_34.rep_ = 0;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize
                (cc,uVar18 + 1,&local_34);
      pLVar20 = (this->assign_).trail.ebo_.buf;
      pDVar5 = (this->levels_).super_type.ebo_.buf;
      pLVar15 = (cc->ebo_).buf;
      local_48 = 1;
      bVar9 = false;
      for (lVar14 = (ulong)uVar18 << 4; lVar14 != 0; lVar14 = lVar14 + -0x10) {
        uVar11 = *(uint *)((long)&pLVar20->rep_ +
                          (ulong)(uint)(*(int *)(&pDVar5[-1].field_0x0 + lVar14) << 2));
        uVar8 = (ulong)local_48;
        local_48 = local_48 + 1;
        pLVar15[uVar8].rep_ = uVar11 & 0xfffffffe ^ 2;
        bVar9 = (bool)(bVar9 | (uVar11 ^ uVar7) < 2);
        if (uVar19 < uVar11 >> 2) {
          uVar19 = uVar11 >> 2;
        }
      }
    }
    else {
      uVar11 = (cc->ebo_).size;
      puVar4 = (this->assign_).assign_.ebo_.buf;
      uVar16 = uVar11;
      while (1 < uVar16) {
        uVar16 = pLVar20[uVar16 - 1].rep_;
        puVar2 = (uint *)((long)puVar4 + (ulong)(uVar16 & 0xfffffffc));
        *puVar2 = *puVar2 | (uint)((uVar16 & 2) == 0) * 4 + 4;
        uVar16 = (cc->ebo_).size - 1;
        (cc->ebo_).size = uVar16;
      }
      iVar13 = uVar11 - 1;
      pLVar20 = (this->assign_).trail.ebo_.buf + (this->assign_).trail.ebo_.size;
      bVar9 = false;
LAB_001650d7:
      if (iVar13 != 0) {
        puVar4 = (this->assign_).assign_.ebo_.buf;
        do {
          uVar11 = pLVar20[-1].rep_;
          pLVar20 = pLVar20 + -1;
          uVar16 = *(uint *)((long)puVar4 + (ulong)(uVar11 & 0xfffffffc));
        } while (((uVar11 & 2) * 2 + 4 & uVar16) == 0);
        uVar11 = uVar11 >> 2;
        iVar13 = iVar13 + -1;
        if (iVar13 == 0) {
          puVar4[uVar11] = uVar16 & 0xfffffff3;
          p.rep_ = pLVar20->rep_;
        }
        else {
          uVar6 = (this->assign_).reason_.super_type.ebo_.buf[uVar11].data_;
          puVar4[uVar11] = uVar16 & 0xfffffff3;
          p.rep_ = pLVar20->rep_;
          if (uVar6 != 0) {
            uVar11 = *(uint *)((long)puVar4 + (ulong)(p.rep_ & 0xfffffffc));
            pLVar15 = pLVar20;
            do {
              pLVar1 = pLVar15 + -1;
              uVar16 = pLVar1->rep_ >> 2;
              if (pLVar15 ==
                  (pointer)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                           (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf +
                                                 ((uVar11 >> 4) - 1)) << 2))) break;
              pLVar15 = pLVar15 + -1;
            } while ((puVar4[uVar16] & (pLVar1->rep_ & 2) * 2 + 4) == 0);
            if ((uVar11 ^ puVar4[uVar16]) < 0x10) {
              reason(this,p,&this->conflict_);
              puVar4 = (this->assign_).assign_.ebo_.buf;
              pLVar15 = (this->conflict_).ebo_.buf;
              uVar8 = (ulong)(this->conflict_).ebo_.size;
              while ((int)uVar8 != 0) {
                uVar8 = (ulong)((int)uVar8 - 1);
                uVar16 = pLVar15[uVar8].rep_;
                uVar12 = *(uint *)((long)puVar4 + (ulong)(uVar16 & 0xfffffffc));
                uVar11 = (uVar16 & 2) * 2 + 4;
                if ((uVar11 & uVar12) == 0) {
                  iVar13 = iVar13 + 1;
                  puVar4[uVar16 >> 2] = uVar11 | uVar12;
                  uVar8 = (ulong)((this->conflict_).ebo_.size - 1);
                }
                (this->conflict_).ebo_.size = (size_type)uVar8;
              }
              goto LAB_001650d7;
            }
          }
        }
        local_38.rep_ = p.rep_ & 0xfffffffe ^ 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(cc,&local_38)
        ;
        uVar11 = pLVar20->rep_ >> 2;
        bVar9 = (bool)(bVar9 | uVar11 == uVar7 >> 2);
        if (uVar19 < uVar11) {
          uVar19 = uVar11;
        }
        goto LAB_001650d7;
      }
      local_48 = (cc->ebo_).size;
    }
  }
  uVar7 = 0x7f;
  if (local_48 < 0x7f) {
    uVar7 = local_48;
  }
  uVar16 = uVar7 << 0x14 | (this->ccInfo_).super_ConstraintScore.rep & 0xfffff;
  uVar7 = (info->super_ConstraintScore).rep;
  uVar12 = uVar7 & 0xf0000000;
  uVar11 = uVar12 + uVar16 + 0x80000000;
  if ((int)uVar7 < 0 == bVar9) {
    uVar11 = uVar12 | uVar16;
  }
  (info->super_ConstraintScore).rep = uVar11;
  if ((this->shared_->varInfo_).ebo_.size - 1 < uVar19 != (bool)((byte)(uVar11 >> 0x1e) & 1)) {
    (info->super_ConstraintScore).rep = uVar11 ^ 0x40000000;
  }
  return uVar18;
}

Assistant:

uint32 Solver::finalizeConflictClause(LitVec& cc, ConstraintInfo& info, uint32 ccRepMode) {
	// 2. clear flags and compute lbd
	uint32  lbd         = 1;
	uint32  onRoot      = 0;
	uint32  varLevel    = 0;
	uint32  assertLevel = 0;
	uint32  assertPos   = 1;
	uint32  maxVar      = cc[0].var();
	Literal tagLit      = ~tagLiteral();
	bool    tagged      = false;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		Var v = cc[i].var();
		clearSeen(v);
		if (cc[i] == tagLit) { tagged = true; }
		if (v > maxVar)      { maxVar = v;    }
		if ( (varLevel = level(v)) > assertLevel ) {
			assertLevel = varLevel;
			assertPos   = static_cast<uint32>(i);
		}
		if (hasLevel(varLevel)) {
			unmarkLevel(varLevel);
			lbd += (varLevel > rootLevel()) || (++onRoot == 1);
		}
	}
	if (assertPos != 1) { std::swap(cc[1], cc[assertPos]); }
	if (ccRepMode == SolverStrategies::cc_rep_dynamic) {
		ccRepMode = double(lbd)/double(decisionLevel()) > .66 ? SolverStrategies::cc_rep_decision : SolverStrategies::cc_rep_uip;
	}
	if (ccRepMode) {
		maxVar = cc[0].var(), tagged = false, lbd = 1;
		if (ccRepMode == SolverStrategies::cc_rep_decision) {
			// replace cc with decision sequence
			cc.resize(assertLevel+1);
			for (uint32 i = assertLevel; i;){
				Literal x = ~decision(i--);
				cc[lbd++] = x;
				if (x == tagLit)     { tagged = true; }
				if (x.var() > maxVar){ maxVar = x.var(); }
			}
		}
		else {
			// replace cc with all uip clause
			uint32 marked = sizeVec(cc) - 1;
			while (cc.size() > 1) { markSeen(~cc.back()); cc.pop_back(); }
			for (LitVec::const_iterator tr = assign_.trail.end(), next, stop; marked;) {
				while (!seen(*--tr)) { ; }
				bool n = --marked != 0 && !reason(*tr).isNull();
				clearSeen(tr->var());
				if (n) { for (next = tr, stop = assign_.trail.begin() + levelStart(level(tr->var())); next-- != stop && !seen(*next);) { ; } }
				if (!n || level(next->var()) != level(tr->var())) {
					cc.push_back(~*tr);
					if (tr->var() == tagLit.var()){ tagged = true; }
					if (tr->var() > maxVar)       { maxVar = tr->var(); }
				}
				else {
					for (reason(*tr, conflict_); !conflict_.empty(); conflict_.pop_back()) {
						if (!seen(conflict_.back())) { ++marked; markSeen(conflict_.back()); }
					}
				}
			}
			lbd = sizeVec(cc);
		}
	}
	info.setScore(makeScore(ccInfo_.activity(), lbd));
	info.setTagged(tagged);
	info.setAux(auxVar(maxVar));
	return assertLevel;
}